

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

uint nullcGetResultType(void)

{
  uint uVar1;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    if (NULLC::currExec == 0) {
      uVar1 = ExecutorRegVm::GetResultType(NULLC::executorRegVm);
      return uVar1;
    }
    if (NULLC::currExec == 1) {
      uVar1 = ExecutorX86::GetResultType(NULLC::executorX86);
      return uVar1;
    }
  }
  return 0;
}

Assistant:

unsigned nullcGetResultType()
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(NULLC_TYPE_VOID);

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86)
		return executorX86->GetResultType();
#endif
#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
	if(currExec == NULLC_LLVM)
		return executorLLVM->GetResultType();
#endif
#ifndef NULLC_NO_EXECUTOR
	if(currExec == NULLC_REG_VM)
		return executorRegVm->GetResultType();
#endif

	return NULLC_TYPE_VOID;
}